

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-double-page-size.cc
# Opt level: O1

void doubleBoxSize(QPDFPageObjectHelper *page,char *box_name)

{
  char cVar1;
  runtime_error *this;
  long *plVar2;
  long *plVar3;
  element_type *peVar4;
  double dVar5;
  iterator __begin1;
  iterator __end1;
  QPDFObjectHandle box;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> doubled;
  undefined1 local_d8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  element_type *peStack_c0;
  vector local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  iterator local_a0;
  string local_78 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  undefined1 local_68 [40];
  QPDFObjectHandle local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8,box_name,(allocator<char> *)&local_a0);
  QPDFPageObjectHelper::getAttribute(local_78,SUB81(page,0));
  if ((element_type *)local_d8._0_8_ != (element_type *)&local_c8) {
    operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_pi + 1));
  }
  cVar1 = QPDFObjectHandle::isNull();
  if (cVar1 == '\0') {
    cVar1 = QPDFObjectHandle::isRectangle();
    if (cVar1 == '\0') {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._0_8_ = local_68 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"box ","");
      plVar2 = (long *)std::__cxx11::string::append(local_68);
      local_a0._vptr_iterator = (_func_int **)*plVar2;
      plVar3 = plVar2 + 2;
      if (local_a0._vptr_iterator == (_func_int **)plVar3) {
        local_a0.m.
        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar3;
        local_a0.ivalue.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)plVar2[3];
        local_a0._vptr_iterator =
             (_func_int **)
             &local_a0.m.
              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
      }
      else {
        local_a0.m.
        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar3;
      }
      local_a0.m.
      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_a0);
      local_d8._0_8_ = *plVar2;
      peVar4 = (element_type *)(plVar2 + 2);
      if ((element_type *)local_d8._0_8_ == peVar4) {
        local_c8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar4;
        peStack_c0 = (element_type *)plVar2[3];
        local_d8._0_8_ = (element_type *)&local_c8;
      }
      else {
        local_c8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)peVar4;
      }
      local_d8._8_8_ = plVar2[1];
      *plVar2 = (long)peVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::runtime_error::runtime_error(this,(string *)local_d8);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = (pointer)0x0;
    local_68._16_8_ = (pointer)0x0;
    QPDFObjectHandle::aitems();
    QPDFObjectHandle::QPDFArrayItems::begin();
    QPDFObjectHandle::QPDFArrayItems::end();
    while( true ) {
      cVar1 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==((iterator *)local_d8,&local_a0)
      ;
      if (cVar1 != '\0') break;
      QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_d8);
      dVar5 = (double)QPDFObjectHandle::getNumericValue();
      QPDFObjectHandle::newReal(dVar5 + dVar5,(int)&local_40,true);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
      emplace_back<QPDFObjectHandle>
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_68,&local_40);
      if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_d8);
    }
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_a0);
    QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_d8);
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
    local_a0._vptr_iterator = *(_func_int ***)(page + 8);
    local_a0.m.
    super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = *(element_type **)(page + 0x10);
    if (local_a0.m.
        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a0.m.
                 super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + 8) =
             *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_a0.m.
                      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a0.m.
                 super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr + 8) =
             *(int *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_a0.m.
                      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 8) + 1;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d8,box_name,(allocator<char> *)&local_40);
    QPDFObjectHandle::newArray(local_b0);
    QPDFObjectHandle::replaceKey((string *)&local_a0,(QPDFObjectHandle *)local_d8);
    if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
    }
    if ((element_type *)local_d8._0_8_ != (element_type *)&local_c8) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_c8._M_pi + 1));
    }
    if (local_a0.m.
        super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a0.m.
                 super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_68);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  return;
}

Assistant:

static void
doubleBoxSize(QPDFPageObjectHelper& page, char const* box_name)
{
    // We need to use getAttribute rather than getKey as some boxes could be inherited.
    auto box = page.getAttribute(box_name, true);
    if (box.isNull()) {
        return;
    }
    if (!box.isRectangle()) {
        throw std::runtime_error(
            std::string("box ") + box_name + " is not an array of four elements");
    }
    std::vector<QPDFObjectHandle> doubled;
    for (auto& item: box.aitems()) {
        doubled.push_back(QPDFObjectHandle::newReal(item.getNumericValue() * 2.0, 2));
    }
    page.getObjectHandle().replaceKey(box_name, QPDFObjectHandle::newArray(doubled));
}